

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *__s1;
  long lVar7;
  exr_context_t e;
  int local_9c;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  local_9c = 0;
  lVar7 = 1;
  bVar2 = false;
  bVar4 = false;
  bVar3 = false;
  while( true ) {
    if (argc <= lVar7) {
      return local_9c;
    }
    __s1 = argv[lVar7];
    cVar1 = *__s1;
    if (((cVar1 == '-') &&
        (((__s1[1] == 'h' && (__s1[2] == '\0')) || ((__s1[1] == '?' && (__s1[2] == '\0')))))) ||
       (iVar5 = strcmp(__s1,"--help"), iVar5 == 0)) break;
    iVar5 = strcmp(__s1,"--version");
    if (iVar5 == 0) {
      printf("exrinfo (OpenEXR) %s  https://openexr.com\n","3.2.0");
      puts("Copyright (c) Contributors to the OpenEXR Project");
      puts("License BSD-3-Clause");
      return 0;
    }
    if ((((cVar1 == '-') && (__s1[1] == 'v')) && (__s1[2] == '\0')) ||
       (iVar5 = strcmp(__s1,"--verbose"), iVar5 == 0)) {
      bVar2 = true;
    }
    else if ((((cVar1 == '-') && (__s1[1] == 'a')) && (__s1[2] == '\0')) ||
            (iVar5 = strcmp(__s1,"--all-metadata"), iVar5 == 0)) {
      bVar4 = true;
    }
    else if ((((cVar1 == '-') && (__s1[1] == 's')) && (__s1[2] == '\0')) ||
            (iVar5 = strcmp(__s1,"--strict"), iVar5 == 0)) {
      bVar3 = true;
    }
    else {
      if (cVar1 == '-') {
        if (__s1[1] != '\0') {
          fprintf(_stderr,
                  "Usage: %s [-v|--verbose] [-a|--all-metadata] [-s|--strict] <filename> [<filename> ...]\n\n"
                  ,*argv);
          return 1;
        }
        local_38 = 0;
        pcStack_70 = stdin_reader;
        if (!bVar2 || bVar3) {
          uVar6 = !bVar2 + 1 + (uint)!bVar2;
          if (!bVar3) {
            uVar6 = 2;
          }
          local_38 = (ulong)uVar6;
        }
        __s1 = "<stdin>";
      }
      else {
        pcStack_70 = (code *)0x0;
        local_38 = 0;
        if (!bVar2 || bVar3) {
          uVar6 = !bVar2 + 1 + (uint)!bVar2;
          if (!bVar3) {
            uVar6 = 2;
          }
          local_38 = (ulong)uVar6;
        }
      }
      uStack_40 = 0xbf800000fffffffe;
      local_48 = 0;
      uStack_50 = 0;
      local_58 = 0;
      uStack_60 = 0;
      local_68 = 0;
      local_78 = 0;
      uStack_80 = 0;
      local_88 = 0;
      local_90 = error_handler_cb;
      local_98 = 0x68;
      e = (exr_context_t)0x0;
      iVar5 = exr_start_read(&e,__s1,&local_98);
      if (iVar5 == 0) {
        exr_print_context_info(e,bVar4 || bVar2);
        exr_finish(&e);
      }
      local_9c = local_9c + (uint)(iVar5 != 0);
    }
    lVar7 = lVar7 + 1;
  }
  usage(_stdout,"exrinfo",1);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    int rv = 0, nfiles = 0, verbose = 0, allmeta = 0, strict = 0;

    for (int a = 1; a < argc; ++a)
    {
        if (!strcmp (argv[a], "-h") || !strcmp (argv[a], "-?") ||
            !strcmp (argv[a], "--help"))
        {
            usage (stdout, "exrinfo", 1);
            return 0;
        }
        else if (!strcmp (argv[a], "--version"))
        {
            printf("exrinfo (OpenEXR) %s  https://openexr.com\n", OPENEXR_VERSION_STRING);
            printf("Copyright (c) Contributors to the OpenEXR Project\n");
            printf("License BSD-3-Clause\n");
            return 0;
        }
        else if (!strcmp (argv[a], "-v") || !strcmp (argv[a], "--verbose"))
        {
            verbose = 1;
        }
        else if (!strcmp (argv[a], "-a") || !strcmp (argv[a], "--all-metadata"))
        {
            allmeta = 1;
        }
        else if (!strcmp (argv[a], "-s") || !strcmp (argv[a], "--strict"))
        {
            strict = 1;
        }
        else if (!strcmp (argv[a], "-"))
        {
            ++nfiles;
            rv += process_stdin (verbose, allmeta, strict);
        }
        else if (argv[a][0] == '-')
        {
            usage (stderr, argv[0], 0);
            return 1;
        }
        else
        {
            ++nfiles;
            rv += process_file (argv[a], verbose, allmeta, strict);
        }
    }

    return rv;
}